

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O3

void __thiscall
gnuplotio::
deref_and_print<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>,gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,float>,gnuplotio::ModeText>
          (gnuplotio *this,
          IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
          *stream,undefined8 param_3,int param_4)

{
  value_type vVar1;
  size_t __n;
  undefined1 local_14 [4];
  
  vVar1 = IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
          ::deref(stream);
  std::ostream::operator<<(this,vVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
  IteratorRange<__gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>,_float>
  ::deref((IteratorRange<__gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>,_float>
           *)(stream + 1));
  FloatTextSender<float>::send((int)this,local_14,__n,param_4);
  return;
}

Assistant:

void deref_and_print(std::ostream &stream, const PairOfRange<T, U> &arg, PrintMode) {
    deref_and_print(stream, arg.l, PrintMode());
    if(PrintMode::is_text) stream << " ";
    deref_and_print(stream, arg.r, PrintMode());
}